

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O0

LogicalTypeComparisonResult duckdb::RequiresCast(LogicalType *source_type,LogicalType *target_type)

{
  LogicalTypeId LVar1;
  bool bVar2;
  LogicalTypeComparisonResult LVar3;
  LogicalType *type;
  LogicalType *in_RSI;
  LogicalType *in_RDI;
  LogicalType *in_stack_ffffffffffffffe0;
  LogicalTypeComparisonResult local_1;
  
  LVar1 = LogicalType::id(in_RSI);
  if (LVar1 == ANY) {
    local_1 = TARGET_IS_ANY;
  }
  else {
    bVar2 = LogicalType::operator==(in_RSI,in_stack_ffffffffffffffe0);
    if (bVar2) {
      local_1 = IDENTICAL_TYPE;
    }
    else {
      LVar1 = LogicalType::id(in_RDI);
      if ((LVar1 == LIST) && (LVar1 = LogicalType::id(in_RSI), LVar1 == LIST)) {
        type = ListType::GetChildType(in_stack_ffffffffffffffe0);
        ListType::GetChildType(type);
        LVar3 = RequiresCast(in_RSI,type);
        return LVar3;
      }
      LVar1 = LogicalType::id(in_RDI);
      if ((LVar1 == ARRAY) && (LVar1 = LogicalType::id(in_RSI), LVar1 == ARRAY)) {
        ArrayType::GetChildType(in_stack_ffffffffffffffe0);
        ArrayType::GetChildType(in_stack_ffffffffffffffe0);
        LVar3 = RequiresCast(in_RSI,in_stack_ffffffffffffffe0);
        return LVar3;
      }
      local_1 = DIFFERENT_TYPES;
    }
  }
  return local_1;
}

Assistant:

LogicalTypeComparisonResult RequiresCast(const LogicalType &source_type, const LogicalType &target_type) {
	if (target_type.id() == LogicalTypeId::ANY) {
		return LogicalTypeComparisonResult::TARGET_IS_ANY;
	}
	if (source_type == target_type) {
		return LogicalTypeComparisonResult::IDENTICAL_TYPE;
	}
	if (source_type.id() == LogicalTypeId::LIST && target_type.id() == LogicalTypeId::LIST) {
		return RequiresCast(ListType::GetChildType(source_type), ListType::GetChildType(target_type));
	}
	if (source_type.id() == LogicalTypeId::ARRAY && target_type.id() == LogicalTypeId::ARRAY) {
		return RequiresCast(ArrayType::GetChildType(source_type), ArrayType::GetChildType(target_type));
	}
	return LogicalTypeComparisonResult::DIFFERENT_TYPES;
}